

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCutUtils.c
# Opt level: O0

Map_Cut_t * Map_CutAlloc(Map_Man_t *p)

{
  Map_Cut_t *__s;
  Map_Match_t *pMatch;
  Map_Cut_t *pCut;
  Map_Man_t *p_local;
  
  __s = (Map_Cut_t *)Extra_MmFixedEntryFetch(p->mmCuts);
  memset(__s,0,0xa0);
  __s->M[0].AreaFlow = 3.4028235e+37;
  __s->M[0].tArrive.Rise = 3.4028235e+37;
  __s->M[0].tArrive.Fall = 3.4028235e+37;
  __s->M[0].tArrive.Worst = 3.4028235e+37;
  __s->M[1].AreaFlow = 3.4028235e+37;
  __s->M[1].tArrive.Rise = 3.4028235e+37;
  __s->M[1].tArrive.Fall = 3.4028235e+37;
  __s->M[1].tArrive.Worst = 3.4028235e+37;
  return __s;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Allocates the cut.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Map_Cut_t * Map_CutAlloc( Map_Man_t * p )
{
    Map_Cut_t * pCut;
    Map_Match_t * pMatch;
    pCut = (Map_Cut_t *)Extra_MmFixedEntryFetch( p->mmCuts );
    memset( pCut, 0, sizeof(Map_Cut_t) );

    pMatch = pCut->M;
    pMatch->AreaFlow       = MAP_FLOAT_LARGE; // unassigned
    pMatch->tArrive.Rise   = MAP_FLOAT_LARGE; // unassigned
    pMatch->tArrive.Fall   = MAP_FLOAT_LARGE; // unassigned
    pMatch->tArrive.Worst  = MAP_FLOAT_LARGE; // unassigned

    pMatch = pCut->M + 1;
    pMatch->AreaFlow       = MAP_FLOAT_LARGE; // unassigned
    pMatch->tArrive.Rise   = MAP_FLOAT_LARGE; // unassigned
    pMatch->tArrive.Fall   = MAP_FLOAT_LARGE; // unassigned
    pMatch->tArrive.Worst  = MAP_FLOAT_LARGE; // unassigned
    return pCut;
}